

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

bool __thiscall pbrt::Image::WritePNG(Image *this,string *name,ImageMetadata *metadata)

{
  ushort uVar1;
  int iVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  uchar uVar5;
  bool bVar6;
  uint uVar7;
  int c;
  long lVar8;
  Image *pIVar9;
  uint uVar10;
  ulong uVar11;
  Point2i p;
  long lVar12;
  ushort *puVar13;
  uint uVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int nOutOfGamut;
  string ret;
  int local_9c;
  uchar *local_98;
  int local_8c;
  Image *local_88;
  string local_80;
  string *local_60;
  long local_58;
  ulong local_50;
  undefined1 *local_48;
  ulong local_40;
  char *local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  local_8c = 0;
  iVar2 = (int)(this->channelNames).nStored;
  if (this->format == U256) {
    if (iVar2 == 3) {
      uVar7 = lodepng_encode24_file
                        ((name->_M_dataplus)._M_p,(this->p8).ptr,
                         (this->resolution).super_Tuple2<pbrt::Point2,_int>.x,
                         (this->resolution).super_Tuple2<pbrt::Point2,_int>.y);
    }
    else {
      if (iVar2 != 1) {
        local_80._M_dataplus._M_p._0_4_ = iVar2;
        LogFatal<int>(Fatal,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                      ,0x530,"Unhandled channel count in WritePNG(): %d",(int *)&local_80);
      }
      uVar7 = lodepng_encode_file((name->_M_dataplus)._M_p,(this->p8).ptr,
                                  (this->resolution).super_Tuple2<pbrt::Point2,_int>.x,
                                  (this->resolution).super_Tuple2<pbrt::Point2,_int>.y,LCT_GREY,8);
    }
  }
  else {
    local_88 = this;
    local_60 = name;
    if (iVar2 == 1) {
      uVar7 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
      uVar14 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
      uVar11 = (ulong)uVar14;
      local_98 = (uchar *)operator_new__((long)(int)(uVar7 * uVar14));
      memset(local_98,0,(long)(int)(uVar7 * uVar14));
      if ((int)uVar7 < 1) {
        local_9c = 0;
      }
      else {
        lVar12 = 0;
        local_9c = 0;
        lVar8 = 0;
        pIVar9 = local_88;
        do {
          if (0 < (int)uVar11) {
            lVar15 = 0;
            do {
              uVar1 = *(ushort *)
                       (BlueNoiseTextures +
                       (ulong)((uint)lVar8 & 0x7f) * 2 + (ulong)(((uint)lVar15 & 0x7f) << 8));
              auVar19._0_4_ =
                   GetChannel(pIVar9,(Point2i)(lVar12 + lVar15),0,(WrapMode2D)0x200000002);
              auVar19._4_60_ = extraout_var_00;
              if ((auVar19._0_4_ < 0.0) || (1.0 < auVar19._0_4_)) {
                local_9c = local_9c + 1;
                local_8c = local_9c;
              }
              if (auVar19._0_4_ <= 0.0) {
                uVar5 = '\0';
              }
              else {
                uVar5 = 0xff;
                if (auVar19._0_4_ < 1.0) {
                  fVar20 = 12.92;
                  if (0.0031308 < auVar19._0_4_) {
                    auVar17 = vmaxss_avx(auVar19._0_16_,ZEXT816(0) << 0x40);
                    auVar17 = vsqrtss_avx(auVar17,auVar17);
                    auVar16 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbc84ba3b),0),auVar17,
                                              ZEXT416(0x3f4151ce));
                    auVar23._0_4_ = auVar17._0_4_;
                    auVar23._4_4_ = auVar23._0_4_;
                    auVar23._8_4_ = auVar23._0_4_;
                    auVar23._12_4_ = auVar23._0_4_;
                    auVar17 = vinsertps_avx(auVar16,ZEXT416((uint)(auVar23._0_4_ + 1.8970238)),0x10)
                    ;
                    auVar17 = vfmadd213ps_fma(auVar17,auVar23,_DAT_00548a60);
                    auVar17 = vfmadd213ps_fma(auVar17,auVar23,_DAT_00548a70);
                    auVar17 = vfmadd213ps_fma(auVar17,auVar23,_DAT_00548a80);
                    auVar16 = vfmadd213ps_fma(auVar17,auVar23,_DAT_00548a90);
                    auVar17 = vmovshdup_avx(auVar16);
                    fVar20 = auVar16._0_4_ / auVar17._0_4_;
                  }
                  auVar24._8_4_ = 0x3effffff;
                  auVar24._0_8_ = 0x3effffff3effffff;
                  auVar24._12_4_ = 0x3effffff;
                  auVar17 = vfmadd213ss_fma(ZEXT416((uint)(auVar19._0_4_ * fVar20)),
                                            SUB6416(ZEXT464(0x437f0000),0),
                                            ZEXT416((uint)((float)uVar1 / 65535.0 + -0.5)));
                  auVar16._8_4_ = 0x80000000;
                  auVar16._0_8_ = 0x8000000080000000;
                  auVar16._12_4_ = 0x80000000;
                  auVar16 = vpternlogd_avx512vl(auVar24,auVar17,auVar16,0xf8);
                  auVar17 = ZEXT416((uint)(auVar17._0_4_ + auVar16._0_4_));
                  auVar16 = vroundss_avx(auVar17,auVar17,0xb);
                  auVar17 = vminss_avx(SUB6416(ZEXT464(0x437f0000),0),auVar16);
                  uVar3 = vcmpss_avx512f(auVar16,ZEXT816(0) << 0x40,1);
                  uVar5 = (uchar)(int)(float)((uint)!(bool)((byte)uVar3 & 1) * auVar17._0_4_);
                }
              }
              iVar2 = (local_88->resolution).super_Tuple2<pbrt::Point2,_int>.x;
              uVar11 = (ulong)iVar2;
              local_98[lVar15 + (int)((uint)lVar8 * iVar2)] = uVar5;
              lVar15 = lVar15 + 1;
              pIVar9 = local_88;
            } while (lVar15 < (long)uVar11);
            uVar7 = (local_88->resolution).super_Tuple2<pbrt::Point2,_int>.y;
          }
          uVar14 = (uint)uVar11;
          lVar8 = lVar8 + 1;
          lVar12 = lVar12 + 0x100000000;
        } while (lVar8 < (int)uVar7);
      }
      name = local_60;
      uVar7 = lodepng_encode_file((local_60->_M_dataplus)._M_p,local_98,uVar14,uVar7,LCT_GREY,8);
    }
    else {
      if (iVar2 != 3) {
        return true;
      }
      uVar7 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
      uVar14 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
      uVar11 = (ulong)(int)(uVar7 * uVar14 * 3);
      local_98 = (uchar *)operator_new__(uVar11);
      memset(local_98,0,uVar11);
      if ((int)uVar14 < 1) {
        local_9c = 0;
      }
      else {
        uVar10 = 0;
        lVar8 = 0;
        local_9c = 0;
        pIVar9 = local_88;
        do {
          if (0 < (int)uVar7) {
            local_50 = lVar8 << 0x20;
            uVar14 = 0;
            local_48 = BlueNoiseTextures + (uVar10 & 0x7f) * 2;
            uVar11 = 0;
            local_58 = lVar8;
            do {
              lVar8 = 0;
              puVar13 = (ushort *)(local_48 + ((uVar14 & 0x7f) << 8));
              p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_50 | uVar11);
              local_40 = uVar11;
              do {
                uVar1 = *puVar13;
                auVar18._0_4_ = GetChannel(pIVar9,p,(int)lVar8,(WrapMode2D)0x200000002);
                auVar18._4_60_ = extraout_var;
                if ((auVar18._0_4_ < 0.0) || (1.0 < auVar18._0_4_)) {
                  local_9c = local_9c + 1;
                  local_8c = local_9c;
                }
                if (auVar18._0_4_ <= 0.0) {
                  uVar5 = '\0';
                }
                else {
                  uVar5 = 0xff;
                  if (auVar18._0_4_ < 1.0) {
                    fVar20 = 12.92;
                    if (0.0031308 < auVar18._0_4_) {
                      auVar17 = vmaxss_avx(auVar18._0_16_,ZEXT816(0) << 0x40);
                      auVar17 = vsqrtss_avx(auVar17,auVar17);
                      auVar16 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbc84ba3b),0),auVar17,
                                                ZEXT416(0x3f4151ce));
                      auVar21._0_4_ = auVar17._0_4_;
                      auVar21._4_4_ = auVar21._0_4_;
                      auVar21._8_4_ = auVar21._0_4_;
                      auVar21._12_4_ = auVar21._0_4_;
                      auVar17 = vinsertps_avx(auVar16,ZEXT416((uint)(auVar21._0_4_ + 1.8970238)),
                                              0x10);
                      auVar17 = vfmadd213ps_fma(auVar17,auVar21,_DAT_00548a60);
                      auVar17 = vfmadd213ps_fma(auVar17,auVar21,_DAT_00548a70);
                      auVar17 = vfmadd213ps_fma(auVar17,auVar21,_DAT_00548a80);
                      auVar16 = vfmadd213ps_fma(auVar17,auVar21,_DAT_00548a90);
                      auVar17 = vmovshdup_avx(auVar16);
                      fVar20 = auVar16._0_4_ / auVar17._0_4_;
                    }
                    auVar22._8_4_ = 0x3effffff;
                    auVar22._0_8_ = 0x3effffff3effffff;
                    auVar22._12_4_ = 0x3effffff;
                    auVar17 = vfmadd213ss_fma(ZEXT416((uint)(auVar18._0_4_ * fVar20)),
                                              SUB6416(ZEXT464(0x437f0000),0),
                                              ZEXT416((uint)((float)uVar1 / 65535.0 + -0.5)));
                    auVar4._8_4_ = 0x80000000;
                    auVar4._0_8_ = 0x8000000080000000;
                    auVar4._12_4_ = 0x80000000;
                    auVar16 = vpternlogd_avx512vl(auVar22,auVar17,auVar4,0xf8);
                    auVar17 = ZEXT416((uint)(auVar17._0_4_ + auVar16._0_4_));
                    auVar16 = vroundss_avx(auVar17,auVar17,0xb);
                    auVar17 = vminss_avx(SUB6416(ZEXT464(0x437f0000),0),auVar16);
                    uVar3 = vcmpss_avx512f(auVar16,ZEXT816(0) << 0x40,1);
                    uVar5 = (uchar)(int)(float)((uint)!(bool)((byte)uVar3 & 1) * auVar17._0_4_);
                  }
                }
                uVar7 = (local_88->resolution).super_Tuple2<pbrt::Point2,_int>.x;
                puVar13 = puVar13 + 0x4000;
                local_98[lVar8 + (long)(int)(uVar10 * uVar7 + uVar14) * 3] = uVar5;
                lVar8 = lVar8 + 1;
                pIVar9 = local_88;
              } while (lVar8 != 3);
              uVar14 = uVar14 + 1;
              uVar11 = local_40 + 1;
            } while ((long)uVar11 < (long)(int)uVar7);
            uVar14 = (local_88->resolution).super_Tuple2<pbrt::Point2,_int>.y;
            lVar8 = local_58;
          }
          lVar8 = lVar8 + 1;
          uVar10 = uVar10 + 1;
        } while (lVar8 < (int)uVar14);
      }
      name = local_60;
      uVar7 = lodepng_encode24_file((local_60->_M_dataplus)._M_p,local_98,uVar7,uVar14);
    }
    operator_delete__(local_98);
    if (0 < local_9c) {
      local_80._M_string_length = 0;
      local_80.field_2._M_local_buf[0] = '\0';
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      detail::stringPrintfRecursive<std::__cxx11::string_const&,int&>
                (&local_80,"%s: %d out of gamut pixel channels clamped to [0,1].",name,&local_8c);
      Warning((FileLoc *)0x0,local_80._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,
                        CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                 local_80.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  if (uVar7 == 0) {
    bVar6 = true;
  }
  else {
    local_38 = lodepng_error_text(uVar7);
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    detail::stringPrintfRecursive<std::__cxx11::string_const&,char_const*>
              (&local_80,"Error writing PNG \"%s\": %s",name,&local_38);
    Error((FileLoc *)0x0,local_80._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,
                      CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                               local_80.field_2._M_local_buf[0]) + 1);
    }
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool Image::WritePNG(const std::string &name, const ImageMetadata &metadata) const {
    unsigned int error = 0;
    int nOutOfGamut = 0;

    if (format == PixelFormat::U256) {
        if (NChannels() == 1)
            error = lodepng_encode_file(name.c_str(), p8.data(), resolution.x,
                                        resolution.y, LCT_GREY, 8 /* bitdepth */);
        else if (NChannels() == 3)
            // TODO: it would be nice to store the color encoding used in the
            // PNG metadata...
            error = lodepng_encode24_file(name.c_str(), p8.data(), resolution.x,
                                          resolution.y);
        else
            LOG_FATAL("Unhandled channel count in WritePNG(): %d", NChannels());
    } else if (NChannels() == 3) {
        // It may not actually be RGB, but that's what PNG's going to
        // assume..
        std::unique_ptr<uint8_t[]> rgb8 =
            std::make_unique<uint8_t[]>(3 * resolution.x * resolution.y);
        for (int y = 0; y < resolution.y; ++y)
            for (int x = 0; x < resolution.x; ++x)
                for (int c = 0; c < 3; ++c) {
                    Float dither = -.5f + BlueNoise(c, {x, y});
                    Float v = GetChannel({x, y}, c);
                    if (v < 0 || v > 1)
                        ++nOutOfGamut;
                    rgb8[3 * (y * resolution.x + x) + c] = LinearToSRGB8(v, dither);
                }

        error =
            lodepng_encode24_file(name.c_str(), rgb8.get(), resolution.x, resolution.y);
    } else if (NChannels() == 1) {
        std::unique_ptr<uint8_t[]> y8 =
            std::make_unique<uint8_t[]>(resolution.x * resolution.y);
        for (int y = 0; y < resolution.y; ++y)
            for (int x = 0; x < resolution.x; ++x) {
                Float dither = -.5f + BlueNoise(0, {x, y});
                Float v = GetChannel({x, y}, 0);
                if (v < 0 || v > 1)
                    ++nOutOfGamut;
                y8[y * resolution.x + x] = LinearToSRGB8(v, dither);
            }

        error = lodepng_encode_file(name.c_str(), y8.get(), resolution.x, resolution.y,
                                    LCT_GREY, 8 /* bitdepth */);
    }

    if (nOutOfGamut > 0)
        Warning("%s: %d out of gamut pixel channels clamped to [0,1].", name,
                nOutOfGamut);

    if (error != 0) {
        Error("Error writing PNG \"%s\": %s", name, lodepng_error_text(error));
        return false;
    }
    return true;
}